

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O3

void __thiscall
ON_BrepRegionTopology::ON_BrepRegionTopology(ON_BrepRegionTopology *this,ON_BrepRegionTopology *src)

{
  int iVar1;
  ON_BrepFaceSide *pOVar2;
  ON_BrepRegion *pOVar3;
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  ON_BrepFaceSideArray::ON_BrepFaceSideArray(&this->m_FS);
  ON_BrepRegionArray::ON_BrepRegionArray(&this->m_R);
  this->m_brep = (ON_Brep *)0x0;
  if (this != src) {
    ON_ClassArray<ON_BrepFaceSide>::operator=
              ((ON_ClassArray<ON_BrepFaceSide> *)this,(ON_ClassArray<ON_BrepFaceSide> *)src);
    ON_ClassArray<ON_BrepRegion>::operator=
              ((ON_ClassArray<ON_BrepRegion> *)&this->m_R,(ON_ClassArray<ON_BrepRegion> *)&src->m_R)
    ;
  }
  auVar4 = _DAT_0069b120;
  iVar1 = (this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.super_ON_ClassArray<ON_BrepFaceSide>.
          m_count;
  if (0 < (long)iVar1) {
    pOVar2 = (this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.super_ON_ClassArray<ON_BrepFaceSide>
             .m_a;
    lVar5 = (long)iVar1 + -1;
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar6 = auVar6 ^ _DAT_0069b120;
    auVar10 = _DAT_0069b170;
    do {
      auVar9 = auVar10 ^ auVar4;
      if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                  auVar6._4_4_ < auVar9._4_4_) & 1)) {
        *(ON_BrepRegionTopology **)((long)&pOVar2->m_rtop + lVar5) = this;
      }
      if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
          auVar9._12_4_ <= auVar6._12_4_) {
        *(ON_BrepRegionTopology **)((long)&pOVar2[1].m_rtop + lVar5) = this;
      }
      lVar8 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar8 + 2;
      lVar5 = lVar5 + 0x60;
    } while ((ulong)(iVar1 + 1U >> 1) * 0x60 != lVar5);
  }
  auVar4 = _DAT_0069b120;
  iVar1 = (this->m_R).super_ON_ObjectArray<ON_BrepRegion>.super_ON_ClassArray<ON_BrepRegion>.m_count
  ;
  if (0 < (long)iVar1) {
    pOVar3 = (this->m_R).super_ON_ObjectArray<ON_BrepRegion>.super_ON_ClassArray<ON_BrepRegion>.m_a;
    lVar5 = (long)iVar1 + -1;
    auVar7._8_4_ = (int)lVar5;
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar7 = auVar7 ^ _DAT_0069b120;
    auVar9 = _DAT_0069b170;
    do {
      auVar10 = auVar9 ^ auVar4;
      if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                  auVar7._4_4_ < auVar10._4_4_) & 1)) {
        *(ON_BrepRegionTopology **)((long)&pOVar3->m_rtop + lVar5) = this;
      }
      if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
          auVar10._12_4_ <= auVar7._12_4_) {
        *(ON_BrepRegionTopology **)((long)&pOVar3[1].m_rtop + lVar5) = this;
      }
      lVar8 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar8 + 2;
      lVar5 = lVar5 + 0xf0;
    } while ((ulong)(iVar1 + 1U >> 1) * 0xf0 - lVar5 != 0);
  }
  return;
}

Assistant:

ON_BrepRegionTopology::ON_BrepRegionTopology(const ON_BrepRegionTopology& src)
{
  int i;
  // do not copy m_brep
  m_brep = 0;
  m_FS = src.m_FS;
  m_R = src.m_R;
  for (i = 0; i < m_FS.Count(); i++ )
    m_FS[i].m_rtop = this;
  for (i = 0; i < m_R.Count(); i++ )
    m_R[i].m_rtop = this;
}